

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

bool __thiscall spirv_cross::CompilerGLSL::should_dereference(CompilerGLSL *this,uint32_t id)

{
  bool bVar1;
  SPIRType *pSVar2;
  SPIRVariable *pSVar3;
  SPIRExpression *pSVar4;
  SPIRType *pSVar5;
  
  pSVar2 = Compiler::expression_type(&this->super_Compiler,id);
  if ((pSVar2->pointer != true) ||
     (bVar1 = Compiler::expression_is_lvalue(&this->super_Compiler,id), !bVar1)) {
    return false;
  }
  pSVar3 = Compiler::maybe_get<spirv_cross::SPIRVariable>(&this->super_Compiler,id);
  if (pSVar3 == (SPIRVariable *)0x0) {
    pSVar4 = Compiler::maybe_get<spirv_cross::SPIRExpression>(&this->super_Compiler,id);
    if (pSVar4 == (SPIRExpression *)0x0) {
      return true;
    }
    if (pSVar4->access_chain != false) {
      return false;
    }
    while( true ) {
      if ((pSVar4->loaded_from).id == 0) {
        return true;
      }
      bVar1 = expression_is_forwarded(this,(pSVar4->super_IVariant).self.id);
      if (!bVar1) {
        return true;
      }
      pSVar5 = Compiler::expression_type(&this->super_Compiler,(pSVar4->loaded_from).id);
      if (pSVar5->pointer != pSVar2->pointer) {
        return true;
      }
      if (pSVar5->pointer_depth != pSVar2->pointer_depth) {
        return true;
      }
      if ((pSVar5->parent_type).id != (pSVar2->parent_type).id) {
        return true;
      }
      pSVar3 = Compiler::maybe_get<spirv_cross::SPIRVariable>
                         (&this->super_Compiler,(pSVar4->loaded_from).id);
      if (pSVar3 != (SPIRVariable *)0x0) break;
      pSVar4 = Compiler::maybe_get<spirv_cross::SPIRExpression>
                         (&this->super_Compiler,(pSVar4->loaded_from).id);
      if (pSVar4 == (SPIRExpression *)0x0) {
        return true;
      }
    }
  }
  return pSVar3->phi_variable;
}

Assistant:

bool CompilerGLSL::should_dereference(uint32_t id)
{
	const auto &type = expression_type(id);
	// Non-pointer expressions don't need to be dereferenced.
	if (!type.pointer)
		return false;

	// Handles shouldn't be dereferenced either.
	if (!expression_is_lvalue(id))
		return false;

	// If id is a variable but not a phi variable, we should not dereference it.
	if (auto *var = maybe_get<SPIRVariable>(id))
		return var->phi_variable;

	if (auto *expr = maybe_get<SPIRExpression>(id))
	{
		// If id is an access chain, we should not dereference it.
		if (expr->access_chain)
			return false;

		// If id is a forwarded copy of a variable pointer, we should not dereference it.
		SPIRVariable *var = nullptr;
		while (expr->loaded_from && expression_is_forwarded(expr->self))
		{
			auto &src_type = expression_type(expr->loaded_from);
			// To be a copy, the pointer and its source expression must be the
			// same type. Can't check type.self, because for some reason that's
			// usually the base type with pointers stripped off. This check is
			// complex enough that I've hoisted it out of the while condition.
			if (src_type.pointer != type.pointer || src_type.pointer_depth != type.pointer_depth ||
			    src_type.parent_type != type.parent_type)
				break;
			if ((var = maybe_get<SPIRVariable>(expr->loaded_from)))
				break;
			if (!(expr = maybe_get<SPIRExpression>(expr->loaded_from)))
				break;
		}

		return !var || var->phi_variable;
	}

	// Otherwise, we should dereference this pointer expression.
	return true;
}